

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O2

int jsimd_can_rgb_gray(void)

{
  uint uVar1;
  
  init_simd();
  if ((char)simd_support < '\0') {
    uVar1 = 1;
  }
  else {
    uVar1 = (simd_support & 8) >> 3;
  }
  return uVar1;
}

Assistant:

GLOBAL(int)
jsimd_can_rgb_gray(void)
{
  init_simd();

  /* The code is optimised for these values only */
  if (BITS_IN_JSAMPLE != 8)
    return 0;
  if (sizeof(JDIMENSION) != 4)
    return 0;
  if ((RGB_PIXELSIZE != 3) && (RGB_PIXELSIZE != 4))
    return 0;

  if ((simd_support & JSIMD_AVX2) &&
      IS_ALIGNED_AVX(jconst_rgb_gray_convert_avx2))
    return 1;
  if ((simd_support & JSIMD_SSE2) &&
      IS_ALIGNED_SSE(jconst_rgb_gray_convert_sse2))
    return 1;

  return 0;
}